

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O2

string * argagg::wrap_line(string *__return_storage_ptr__,string *single_line,size_t wrap_width)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  string local_d0;
  string local_b0;
  string indent;
  string result;
  string line;
  
  lVar1 = std::__cxx11::string::find_first_not_of((char *)single_line,0x14cd04);
  if (lVar1 == -1) {
    lVar1 = 0;
  }
  lstrip(&line,single_line);
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  std::__cxx11::string::_M_construct((ulong)&indent,(char)lVar1);
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  lVar3 = 0;
  lVar4 = 0;
  while( true ) {
    lVar2 = std::__cxx11::string::find_first_of((char *)&line,0x14cd04);
    if (lVar2 == -1) break;
    if (wrap_width + lVar4 < (ulong)(lVar2 + lVar1)) {
      std::__cxx11::string::substr((ulong)&local_d0,(ulong)&line);
      construct_line(&local_b0,&indent,&local_d0);
      std::__cxx11::string::append((string *)&result);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      lVar4 = lVar3;
    }
    lVar3 = lVar2 + 1;
  }
  std::__cxx11::string::substr((ulong)&local_d0,(ulong)&line);
  construct_line(&local_b0,&indent,&local_d0);
  std::operator+(__return_storage_ptr__,&result,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&indent);
  std::__cxx11::string::~string((string *)&line);
  return __return_storage_ptr__;
}

Assistant:

inline
std::string wrap_line(const std::string& single_line,
                      const std::size_t wrap_width)
{
  auto indentation_spaces = single_line.find_first_not_of(" ");
  if (indentation_spaces == std::string::npos) {
    indentation_spaces = 0;
  }

  const auto line = lstrip(single_line);
  const auto indent = std::string(indentation_spaces, ' ');

  std::string result;

  std::size_t position = 0;
  std::size_t line_start = 0;
  while (true) {
    const auto new_position = line.find_first_of(" ", position);
    if (new_position == std::string::npos) {
      break;
    }

    if (new_position + indentation_spaces > line_start + wrap_width) {
      result += construct_line(
        indent, line.substr(line_start, position - line_start - 1));

      line_start = position;
    }

    position = new_position + 1;
  }

  return result + construct_line(indent, line.substr(line_start));
}